

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O2

bool __thiscall
booster::locale::util::gregorian_calendar::same(gregorian_calendar *this,abstract_calendar *other)

{
  long lVar1;
  
  if (other != (abstract_calendar *)0x0) {
    lVar1 = __dynamic_cast(other,&abstract_calendar::typeinfo,&typeinfo,0);
    if (lVar1 == 0) {
      return false;
    }
    if ((*(int *)(lVar1 + 0x8c) == this->tzoff_) &&
       ((bool)*(char *)(lVar1 + 0x89) == this->is_local_)) {
      return *(int *)(lVar1 + 8) == this->first_day_of_week_;
    }
  }
  return false;
}

Assistant:

virtual bool same(abstract_calendar const *other) const 
            {
                gregorian_calendar const *gcal = dynamic_cast<gregorian_calendar const *>(other);
                if(!gcal)
                    return false;
                return 
                    gcal->tzoff_ == tzoff_ 
                    && gcal->is_local_ == is_local_
                    && gcal->first_day_of_week_  == first_day_of_week_;
            }